

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O0

Move * puppup::movegen::moveCommand
                 (Move *__return_storage_ptr__,idx step,idx cursor,string *word_s,State *state,
                 Gaddag *gaddag)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  reference pcVar5;
  ostream *poVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  idx iVar9;
  long lVar10;
  bool bVar11;
  idx local_108;
  idx wordid;
  idx score;
  idx bingo;
  idx ocursor;
  idx ostep;
  idx o;
  long lStack_98;
  bool works;
  idx orth_score;
  chr actual_letter;
  chr letter;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  idx placed;
  nodeid node;
  idx word_mult;
  idx multipliable_score;
  idx non_multipliable_score;
  idx blanks;
  Gaddag *gaddag_local;
  State *state_local;
  string *word_s_local;
  idx cursor_local;
  idx step_local;
  
  non_multipliable_score = 0;
  multipliable_score = 0;
  word_mult = 0;
  node = 1;
  placed = trie::Gaddag::get(gaddag,0,0x1f);
  __range2 = (string *)0x0;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_78._M_current = (char *)std::__cxx11::string::end();
  word_s_local = (string *)cursor;
  while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88), bVar3) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar1 = *pcVar5;
    actual_letter = 0x1a;
    if ((cVar1 < 'a') || ('z' < cVar1)) {
      if ((cVar1 < 'A') || ('Z' < cVar1)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"unexpected character! ");
        poVar6 = std::operator<<(poVar6,cVar1);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        actual_letter = *(chr *)(stridx + ((long)cVar1 + 0x20) * 8);
        non_multipliable_score = (ulong)(word_s_local + 1) | non_multipliable_score << 0x10;
      }
      orth_score = 0x1a;
    }
    else {
      orth_score = *(idx *)(stridx + (long)cVar1 * 8);
      actual_letter = orth_score;
    }
    if (placed == -1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"move command contains illegal word! ");
      poVar6 = std::operator<<(poVar6,(string *)word_s);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      placed = trie::Gaddag::get(gaddag,placed,actual_letter);
    }
    pvVar7 = std::array<long,_256UL>::operator[](&state->board,(size_type)word_s_local);
    if (*pvVar7 == 0x1b) {
      __range2 = __range2 + 1;
      lVar10 = *(long *)(board::letter_multiplier + (long)word_s_local * 8);
      pvVar8 = std::array<long,_32UL>::operator[]((array<long,_32UL> *)scores,orth_score);
      lVar10 = lVar10 * *pvVar8;
      node = *(long *)(board::word_multiplier + (long)word_s_local * 8) * node;
      lStack_98 = 0;
      bVar3 = false;
      for (ostep = -1; ostep < 2; ostep = ostep + 2) {
        iVar9 = __impl::turn(step);
        bingo = (idx)word_s_local;
        while( true ) {
          bingo = bingo + iVar9 * ostep;
          bVar4 = __impl::edge(bingo);
          bVar11 = false;
          if (!bVar4) {
            pvVar7 = std::array<long,_256UL>::operator[](&state->board,bingo);
            bVar11 = *pvVar7 != 0x1b;
          }
          if (!bVar11) break;
          pvVar7 = std::array<long,_256UL>::operator[](&state->letter_score,bingo);
          lStack_98 = *pvVar7 + lStack_98;
          bVar3 = true;
        }
      }
      if (bVar3) {
        lVar2 = *(long *)(board::letter_multiplier + (long)word_s_local * 8);
        pvVar8 = std::array<long,_32UL>::operator[]((array<long,_32UL> *)scores,orth_score);
        multipliable_score =
             (lVar2 * *pvVar8 + lStack_98) *
             *(long *)(board::word_multiplier + (long)word_s_local * 8) + multipliable_score;
      }
    }
    else {
      pvVar7 = std::array<long,_256UL>::operator[](&state->letter_score,(size_type)word_s_local);
      lVar10 = *pvVar7;
    }
    word_mult = lVar10 + word_mult;
    word_s_local = word_s_local + step;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  lVar10 = 0;
  if (6 < (long)__range2) {
    lVar10 = 0x23;
  }
  if (placed == -1) {
    local_108 = -1;
  }
  else {
    local_108 = trie::Gaddag::nodeToWord(gaddag,placed);
  }
  __return_storage_ptr__->score = multipliable_score + node * word_mult + lVar10;
  __return_storage_ptr__->word = local_108;
  __return_storage_ptr__->cursor = (idx)word_s_local;
  __return_storage_ptr__->step = step;
  __return_storage_ptr__->blanks = non_multipliable_score;
  return __return_storage_ptr__;
}

Assistant:

inline Move moveCommand(idx step, idx cursor, std::string word_s,
                        const board::State& state, const trie::Gaddag& gaddag) {
    idx blanks = 0;
    idx non_multipliable_score = 0;
    idx multipliable_score = 0;
    idx word_mult = 1;
    trie::nodeid node = gaddag.get(0, trie::rev_marker);
    idx placed = 0;
    for (char c : word_s) {
        chr letter = blank;
        chr actual_letter = blank;
        if (c >= 'a' && c <= 'z') {
            actual_letter = letter = stridx[(idx)c];
        } else if (c >= 'A' && c <= 'Z') {
            letter = stridx[(idx)c + 'a' - 'A'];
            actual_letter = blank;
            blanks <<= idx(16LL);
            blanks |= cursor + 1;
        } else {
            std::cerr << "unexpected character! " << c << std::endl;
        }
        if (node != -1) {
            node = gaddag.get(node, letter);
        } else {
            std::cerr << "move command contains illegal word! " << word_s
                      << std::endl;
        }
        if (state.board[cursor] == emptiness) {
            ++placed;
            multipliable_score +=
                board::letter_multiplier[cursor] * scores[actual_letter];
            word_mult *= board::word_multiplier[cursor];

            idx orth_score = 0;
            bool works = false;
            for (idx o = -1; o <= 1; o += 2) {
                idx ostep = __impl::turn(step) * o;
                for (idx ocursor = cursor + ostep;
                     !__impl::edge(ocursor) &&
                     state.board[ocursor] != emptiness;
                     ocursor += ostep) {
                    orth_score += state.letter_score[ocursor];
                    works = true;
                }
            }

            if (works) {
                orth_score +=
                    board::letter_multiplier[cursor] * scores[actual_letter];
                non_multipliable_score +=
                    orth_score * board::word_multiplier[cursor];
            }
        } else {
            multipliable_score += state.letter_score[cursor];
        }
        cursor += step;
    }
    const idx bingo = placed >= 7 ? bingo_bonus : 0;
    const idx score =
        non_multipliable_score + word_mult * multipliable_score + bingo;
    // std::cerr << "nms: " << non_multipliable_score << std::endl;
    // std::cerr << "ms: " << multipliable_score << std::endl;
    // std::cerr << "mult: " << word_mult << std::endl;
    const idx wordid = node == -1 ? -1 : gaddag.nodeToWord(node);
    return Move{score, wordid, cursor, step, blanks};
}